

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O2

bool __thiscall FIX::ExeceptionStore::set(ExeceptionStore *this,int param_1,string *param_2)

{
  IOException *this_00;
  undefined4 in_register_00000034;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (IOException *)__cxa_allocate_exception(0x50,CONCAT44(in_register_00000034,param_1));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"set threw an IOException",&local_39);
  IOException::IOException(this_00,&local_38);
  __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
}

Assistant:

bool set( int, const std::string& ) EXCEPT ( IOException ) {
    throw IOException("set threw an IOException");
  }